

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O2

LispPTR N_OP_putbitsnfd(LispPTR base,LispPTR data,int word_offset,int beta)

{
  byte bVar1;
  
  if ((data & 0xfff0000) == 0xe0000) {
    bVar1 = ((byte)(beta & 0xfU) ^ 0xf) - (char)((uint)beta >> 4);
    *(ushort *)((ulong)(Lisp_world + (word_offset + base)) ^ 2) =
         ~(ushort)(mask_array[beta & 0xfU] << (bVar1 & 0x1f)) &
         *(ushort *)((ulong)(Lisp_world + (word_offset + base)) ^ 2) |
         (ushort)((data & mask_array[beta & 0xfU]) << (bVar1 & 0x1f));
    return base;
  }
  MachineState.tosvalue = data;
  MachineState.errorexit = 1;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_putbitsnfd(LispPTR base, LispPTR data, int word_offset,
                        int beta) {
  DLword *pword;
  int shift_size, field_size, fmask;

#ifdef CHECK
  if (base > POINTERMASK) { error("getbits: base out of range"); }
  if (beta > 0xFF) { error("bad beta argument to PUTBITS"); }
#endif

  if ((SEGMASK & data) != S_POSITIVE) { ERROR_EXIT(data); }

  pword = NativeAligned2FromLAddr(base + word_offset);
  field_size = 0xF & beta;
  shift_size = 15 - (beta >> 4) - field_size;
  fmask = mask_array[field_size] << shift_size;
  GETWORD(pword) = ((data << shift_size) & fmask) | (GETWORD(pword) & (~fmask));

  return (base);
}